

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsPrivateSetProperty(JsValueRef object,JsValueRef key,JsValueRef value)

{
  anon_class_24_3_952db5e6 fn;
  JsErrorCode JVar1;
  JsValueRef *in_stack_ffffffffffffffc0;
  JsValueRef local_20;
  JsValueRef value_local;
  JsValueRef key_local;
  JsValueRef object_local;
  
  fn.key = &local_20;
  fn.object = &value_local;
  fn.value = in_stack_ffffffffffffffc0;
  local_20 = value;
  value_local = key;
  key_local = object;
  JVar1 = ContextAPIWrapper<false,JsPrivateSetProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsPrivateSetProperty(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _In_ JsValueRef value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTSetIndex, object, key, value);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(key, scriptContext);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(object);

        if (!dynObj->HasObjectArray())
        {
            Js::ArrayObject* objArray = scriptContext->GetLibrary()->CreateArray();
            dynObj->SetObjectArray(objArray);
        }
        Js::JavascriptOperators::OP_SetElementI(dynObj->GetObjectArray(), key, value, scriptContext);

        return JsNoError;
    });
}